

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void TestLength<unsigned_char,short>(char *length_spec,short value)

{
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view format_10;
  ulong uVar1;
  bool bVar2;
  short sVar3;
  uint uVar4;
  AssertHelper *this;
  void *this_00;
  char *file;
  char *expected_expression;
  byte in_SIL;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ostringstream os;
  unsigned_long_long max;
  unsigned_long_long unsigned_value;
  longlong signed_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff468;
  Message *in_stack_fffffffffffff470;
  char *in_stack_fffffffffffff478;
  int iVar5;
  char *in_stack_fffffffffffff480;
  undefined8 in_stack_fffffffffffff488;
  Type TVar7;
  allocator *paVar6;
  AssertHelper *in_stack_fffffffffffff490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff498;
  Message *in_stack_fffffffffffff4a0;
  Message *in_stack_fffffffffffff4a8;
  Message *in_stack_fffffffffffff4d8;
  AssertHelper *in_stack_fffffffffffff4e0;
  string local_a80 [48];
  string local_a50 [32];
  string local_a30 [32];
  string local_a10 [32];
  AssertionResult local_9f0;
  string local_9d8 [40];
  string local_9b0 [48];
  string local_980 [32];
  string local_960 [32];
  AssertionResult local_940;
  allocator local_929;
  string local_928 [48];
  string local_8f8 [48];
  string local_8c8 [32];
  string local_8a8 [32];
  string local_888 [32];
  AssertionResult local_868;
  string local_850 [40];
  string local_828 [48];
  string local_7f8 [32];
  string local_7d8 [32];
  AssertionResult local_7b8;
  allocator local_7a1;
  string local_7a0 [48];
  string local_770 [48];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  AssertionResult local_6e0;
  string local_6c8 [40];
  string local_6a0 [48];
  string local_670 [32];
  string local_650 [32];
  AssertionResult local_630;
  allocator local_619;
  string local_618 [48];
  string local_5e8 [48];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  AssertionResult local_558;
  string local_540 [40];
  string local_518 [48];
  string local_4e8 [32];
  string local_4c8 [32];
  AssertionResult local_4a8;
  allocator local_491;
  string local_490 [48];
  string local_460 [48];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  AssertionResult local_3d0;
  string local_3b8 [40];
  string local_390 [48];
  string local_360 [32];
  string local_340 [32];
  AssertionResult local_320 [2];
  string local_300 [48];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  AssertionResult local_270;
  string local_258 [40];
  string local_230 [48];
  string local_200 [32];
  string local_1e0 [32];
  AssertionResult local_1c0 [2];
  ostringstream local_1a0 [376];
  ulong local_28;
  ulong local_20;
  longlong local_18;
  byte local_a;
  
  TVar7 = (Type)((ulong)in_stack_fffffffffffff488 >> 0x20);
  local_18 = 0;
  local_20 = 0;
  local_a = in_SIL;
  sVar3 = std::numeric_limits<short>::max();
  local_28 = (long)sVar3;
  uVar4 = std::numeric_limits<int>::max();
  bVar2 = fmt::v5::internal::const_check<bool>((ulong)(long)sVar3 <= (ulong)uVar4);
  uVar1 = local_28;
  if (!bVar2) {
    uVar4 = std::numeric_limits<unsigned_int>::max();
    fmt::v5::internal::const_check<bool>(uVar1 <= uVar4);
  }
  local_18 = (longlong)(char)local_a;
  local_20 = (ulong)local_a;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::ostream::operator<<(local_1a0,local_18);
  std::__cxx11::ostringstream::str();
  fmt::v5::format<char[5],char_const*>
            ((char (*) [5])in_stack_fffffffffffff498,(char **)in_stack_fffffffffffff490);
  fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
            ((basic_string_view<char> *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
  format.size_ = (size_t)in_stack_fffffffffffff468;
  format.data_ = (char *)in_stack_fffffffffffff460;
  test_sprintf<short>(format,(short *)in_stack_fffffffffffff458);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffff478,(char *)in_stack_fffffffffffff470,in_stack_fffffffffffff468,
             in_stack_fffffffffffff460);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string(local_1e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_1c0);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff490);
    testing::Message::operator<<
              ((Message *)in_stack_fffffffffffff460,(char (*) [9])in_stack_fffffffffffff458);
    fmt::v5::format<char[5],char_const*>
              ((char (*) [5])in_stack_fffffffffffff498,(char **)in_stack_fffffffffffff490);
    testing::Message::operator<<((Message *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
    testing::AssertionResult::failure_message((AssertionResult *)0x1aaa48);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff490,TVar7,in_stack_fffffffffffff480,
               (int)((ulong)in_stack_fffffffffffff478 >> 0x20),(char *)in_stack_fffffffffffff470);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff460);
    std::__cxx11::string::~string(local_258);
    testing::Message::~Message((Message *)0x1aaab8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1aab4f);
  std::__cxx11::ostringstream::str();
  fmt::v5::format<char[5],char_const*>
            ((char (*) [5])in_stack_fffffffffffff498,(char **)in_stack_fffffffffffff490);
  fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
            ((basic_string_view<char> *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
  format_05.size_ = (size_t)in_stack_fffffffffffff4a8;
  format_05.data_ = (char *)in_stack_fffffffffffff4a0;
  make_positional_abi_cxx11_(format_05);
  fmt::v5::sprintf<std::__cxx11::string,short>
            (in_stack_fffffffffffff498,(short *)in_stack_fffffffffffff490);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffff478,(char *)in_stack_fffffffffffff470,in_stack_fffffffffffff468,
             in_stack_fffffffffffff460);
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::string::~string(local_2d0);
  std::__cxx11::string::~string(local_300);
  std::__cxx11::string::~string(local_290);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_270);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff490);
    testing::AssertionResult::failure_message((AssertionResult *)0x1aad10);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff490,TVar7,in_stack_fffffffffffff480,
               (int)((ulong)in_stack_fffffffffffff478 >> 0x20),(char *)in_stack_fffffffffffff470);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff460);
    testing::Message::~Message((Message *)0x1aad73);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1aade4);
  std::__cxx11::ostringstream::str();
  fmt::v5::format<char[5],char_const*>
            ((char (*) [5])in_stack_fffffffffffff498,(char **)in_stack_fffffffffffff490);
  fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
            ((basic_string_view<char> *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
  format_00.size_ = (size_t)in_stack_fffffffffffff468;
  format_00.data_ = (char *)in_stack_fffffffffffff460;
  test_sprintf<short>(format_00,(short *)in_stack_fffffffffffff458);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffff478,(char *)in_stack_fffffffffffff470,in_stack_fffffffffffff468,
             in_stack_fffffffffffff460);
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string(local_390);
  std::__cxx11::string::~string(local_340);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_320);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff490);
    testing::Message::operator<<
              ((Message *)in_stack_fffffffffffff460,(char (*) [9])in_stack_fffffffffffff458);
    fmt::v5::format<char[5],char_const*>
              ((char (*) [5])in_stack_fffffffffffff498,(char **)in_stack_fffffffffffff490);
    testing::Message::operator<<((Message *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
    testing::AssertionResult::failure_message((AssertionResult *)0x1aafb9);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff490,TVar7,in_stack_fffffffffffff480,
               (int)((ulong)in_stack_fffffffffffff478 >> 0x20),(char *)in_stack_fffffffffffff470);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff460);
    std::__cxx11::string::~string(local_3b8);
    testing::Message::~Message((Message *)0x1ab029);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ab0c0);
  std::__cxx11::ostringstream::str();
  fmt::v5::format<char[5],char_const*>
            ((char (*) [5])in_stack_fffffffffffff498,(char **)in_stack_fffffffffffff490);
  fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
            ((basic_string_view<char> *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
  format_06.size_ = (size_t)in_stack_fffffffffffff4a8;
  format_06.data_ = (char *)in_stack_fffffffffffff4a0;
  make_positional_abi_cxx11_(format_06);
  fmt::v5::sprintf<std::__cxx11::string,short>
            (in_stack_fffffffffffff498,(short *)in_stack_fffffffffffff490);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffff478,(char *)in_stack_fffffffffffff470,in_stack_fffffffffffff468,
             in_stack_fffffffffffff460);
  std::__cxx11::string::~string(local_410);
  std::__cxx11::string::~string(local_430);
  std::__cxx11::string::~string(local_460);
  std::__cxx11::string::~string(local_3f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3d0);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff490);
    testing::AssertionResult::failure_message((AssertionResult *)0x1ab281);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff490,TVar7,in_stack_fffffffffffff480,
               (int)((ulong)in_stack_fffffffffffff478 >> 0x20),(char *)in_stack_fffffffffffff470);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff460);
    testing::Message::~Message((Message *)0x1ab2e4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ab355);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_490,"",&local_491);
  std::__cxx11::ostringstream::str((string *)local_1a0);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  std::ostream::operator<<(local_1a0,local_20);
  std::__cxx11::ostringstream::str();
  fmt::v5::format<char[5],char_const*>
            ((char (*) [5])in_stack_fffffffffffff498,(char **)in_stack_fffffffffffff490);
  fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
            ((basic_string_view<char> *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
  format_01.size_ = (size_t)in_stack_fffffffffffff468;
  format_01.data_ = (char *)in_stack_fffffffffffff460;
  test_sprintf<short>(format_01,(short *)in_stack_fffffffffffff458);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffff478,(char *)in_stack_fffffffffffff470,in_stack_fffffffffffff468,
             in_stack_fffffffffffff460);
  std::__cxx11::string::~string(local_4e8);
  std::__cxx11::string::~string(local_518);
  std::__cxx11::string::~string(local_4c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_4a8);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff490);
    testing::Message::operator<<
              ((Message *)in_stack_fffffffffffff460,(char (*) [9])in_stack_fffffffffffff458);
    fmt::v5::format<char[5],char_const*>
              ((char (*) [5])in_stack_fffffffffffff498,(char **)in_stack_fffffffffffff490);
    testing::Message::operator<<((Message *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
    testing::AssertionResult::failure_message((AssertionResult *)0x1ab5ee);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff490,TVar7,in_stack_fffffffffffff480,
               (int)((ulong)in_stack_fffffffffffff478 >> 0x20),(char *)in_stack_fffffffffffff470);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff460);
    std::__cxx11::string::~string(local_540);
    testing::Message::~Message((Message *)0x1ab65e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ab6f5);
  std::__cxx11::ostringstream::str();
  fmt::v5::format<char[5],char_const*>
            ((char (*) [5])in_stack_fffffffffffff498,(char **)in_stack_fffffffffffff490);
  fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
            ((basic_string_view<char> *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
  format_07.size_ = (size_t)in_stack_fffffffffffff4a8;
  format_07.data_ = (char *)in_stack_fffffffffffff4a0;
  make_positional_abi_cxx11_(format_07);
  fmt::v5::sprintf<std::__cxx11::string,short>
            (in_stack_fffffffffffff498,(short *)in_stack_fffffffffffff490);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffff478,(char *)in_stack_fffffffffffff470,in_stack_fffffffffffff468,
             in_stack_fffffffffffff460);
  std::__cxx11::string::~string(local_598);
  std::__cxx11::string::~string(local_5b8);
  std::__cxx11::string::~string(local_5e8);
  std::__cxx11::string::~string(local_578);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_558);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff490);
    testing::AssertionResult::failure_message((AssertionResult *)0x1ab8b6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff490,TVar7,in_stack_fffffffffffff480,
               (int)((ulong)in_stack_fffffffffffff478 >> 0x20),(char *)in_stack_fffffffffffff470);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff460);
    testing::Message::~Message((Message *)0x1ab919);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ab98a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_618,"",&local_619);
  std::__cxx11::ostringstream::str((string *)local_1a0);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  this = (AssertHelper *)std::ostream::operator<<(local_1a0,std::oct);
  std::ostream::operator<<(this,local_20);
  std::__cxx11::ostringstream::str();
  fmt::v5::format<char[5],char_const*>
            ((char (*) [5])in_stack_fffffffffffff498,(char **)in_stack_fffffffffffff490);
  fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
            ((basic_string_view<char> *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
  format_02.size_ = (size_t)in_stack_fffffffffffff468;
  format_02.data_ = (char *)in_stack_fffffffffffff460;
  test_sprintf<short>(format_02,(short *)in_stack_fffffffffffff458);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffff478,(char *)in_stack_fffffffffffff470,in_stack_fffffffffffff468,
             in_stack_fffffffffffff460);
  std::__cxx11::string::~string(local_670);
  std::__cxx11::string::~string(local_6a0);
  std::__cxx11::string::~string(local_650);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_630);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff490);
    in_stack_fffffffffffff4d8 =
         testing::Message::operator<<
                   ((Message *)in_stack_fffffffffffff460,(char (*) [9])in_stack_fffffffffffff458);
    fmt::v5::format<char[5],char_const*>
              ((char (*) [5])in_stack_fffffffffffff498,(char **)in_stack_fffffffffffff490);
    testing::Message::operator<<((Message *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
    testing::AssertionResult::failure_message((AssertionResult *)0x1abc3e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff490,TVar7,in_stack_fffffffffffff480,
               (int)((ulong)in_stack_fffffffffffff478 >> 0x20),(char *)in_stack_fffffffffffff470);
    testing::internal::AssertHelper::operator=(this,in_stack_fffffffffffff4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff460);
    std::__cxx11::string::~string(local_6c8);
    testing::Message::~Message((Message *)0x1abca5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1abd3c);
  std::__cxx11::ostringstream::str();
  fmt::v5::format<char[5],char_const*>
            ((char (*) [5])in_stack_fffffffffffff498,(char **)in_stack_fffffffffffff490);
  fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
            ((basic_string_view<char> *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
  format_08.size_ = (size_t)in_stack_fffffffffffff4a8;
  format_08.data_ = (char *)in_stack_fffffffffffff4a0;
  make_positional_abi_cxx11_(format_08);
  fmt::v5::sprintf<std::__cxx11::string,short>
            (in_stack_fffffffffffff498,(short *)in_stack_fffffffffffff490);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffff478,(char *)in_stack_fffffffffffff470,in_stack_fffffffffffff468,
             in_stack_fffffffffffff460);
  std::__cxx11::string::~string(local_720);
  std::__cxx11::string::~string(local_740);
  std::__cxx11::string::~string(local_770);
  std::__cxx11::string::~string(local_700);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_6e0);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff490);
    testing::AssertionResult::failure_message((AssertionResult *)0x1abefd);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff490,TVar7,in_stack_fffffffffffff480,
               (int)((ulong)in_stack_fffffffffffff478 >> 0x20),(char *)in_stack_fffffffffffff470);
    testing::internal::AssertHelper::operator=(this,in_stack_fffffffffffff4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff460);
    testing::Message::~Message((Message *)0x1abf5a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1abfcb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7a0,"",&local_7a1);
  std::__cxx11::ostringstream::str((string *)local_1a0);
  std::__cxx11::string::~string(local_7a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
  this_00 = (void *)std::ostream::operator<<(local_1a0,std::hex);
  std::ostream::operator<<(this_00,local_20);
  std::__cxx11::ostringstream::str();
  fmt::v5::format<char[5],char_const*>
            ((char (*) [5])in_stack_fffffffffffff498,(char **)in_stack_fffffffffffff490);
  fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
            ((basic_string_view<char> *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
  format_03.size_ = (size_t)in_stack_fffffffffffff468;
  format_03.data_ = (char *)in_stack_fffffffffffff460;
  test_sprintf<short>(format_03,(short *)in_stack_fffffffffffff458);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffff478,(char *)in_stack_fffffffffffff470,in_stack_fffffffffffff468,
             in_stack_fffffffffffff460);
  std::__cxx11::string::~string(local_7f8);
  std::__cxx11::string::~string(local_828);
  std::__cxx11::string::~string(local_7d8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_7b8);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff490);
    in_stack_fffffffffffff4a8 =
         testing::Message::operator<<
                   ((Message *)in_stack_fffffffffffff460,(char (*) [9])in_stack_fffffffffffff458);
    fmt::v5::format<char[5],char_const*>
              ((char (*) [5])in_stack_fffffffffffff498,(char **)in_stack_fffffffffffff490);
    in_stack_fffffffffffff4a0 =
         testing::Message::operator<<
                   ((Message *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
    in_stack_fffffffffffff498 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x1ac26d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff490,TVar7,in_stack_fffffffffffff480,
               (int)((ulong)in_stack_fffffffffffff478 >> 0x20),(char *)in_stack_fffffffffffff470);
    testing::internal::AssertHelper::operator=(this,in_stack_fffffffffffff4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff460);
    std::__cxx11::string::~string(local_850);
    testing::Message::~Message((Message *)0x1ac2d4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ac36b);
  std::__cxx11::ostringstream::str();
  fmt::v5::format<char[5],char_const*>
            ((char (*) [5])in_stack_fffffffffffff498,(char **)in_stack_fffffffffffff490);
  fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
            ((basic_string_view<char> *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
  format_09.size_ = (size_t)in_stack_fffffffffffff4a8;
  format_09.data_ = (char *)in_stack_fffffffffffff4a0;
  make_positional_abi_cxx11_(format_09);
  fmt::v5::sprintf<std::__cxx11::string,short>
            (in_stack_fffffffffffff498,(short *)in_stack_fffffffffffff490);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffff478,(char *)in_stack_fffffffffffff470,in_stack_fffffffffffff468,
             in_stack_fffffffffffff460);
  iVar5 = (int)((ulong)in_stack_fffffffffffff478 >> 0x20);
  std::__cxx11::string::~string(local_8a8);
  std::__cxx11::string::~string(local_8c8);
  std::__cxx11::string::~string(local_8f8);
  std::__cxx11::string::~string(local_888);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_868);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff490);
    in_stack_fffffffffffff490 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1ac52c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff490,TVar7,in_stack_fffffffffffff480,iVar5,
               (char *)in_stack_fffffffffffff470);
    testing::internal::AssertHelper::operator=(this,in_stack_fffffffffffff4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff460);
    testing::Message::~Message((Message *)0x1ac589);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ac5fa);
  paVar6 = &local_929;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_928,"",paVar6);
  TVar7 = (Type)((ulong)paVar6 >> 0x20);
  std::__cxx11::ostringstream::str((string *)local_1a0);
  std::__cxx11::string::~string(local_928);
  std::allocator<char>::~allocator((allocator<char> *)&local_929);
  file = (char *)std::ostream::operator<<(local_1a0,std::hex);
  expected_expression = (char *)std::ostream::operator<<(file,std::uppercase);
  std::ostream::operator<<(expected_expression,local_20);
  std::__cxx11::ostringstream::str();
  fmt::v5::format<char[5],char_const*>
            ((char (*) [5])in_stack_fffffffffffff498,(char **)in_stack_fffffffffffff490);
  fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
            ((basic_string_view<char> *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
  format_04.size_ = (size_t)in_stack_fffffffffffff468;
  format_04.data_ = (char *)in_stack_fffffffffffff460;
  test_sprintf<short>(format_04,(short *)in_stack_fffffffffffff458);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (expected_expression,(char *)in_stack_fffffffffffff470,in_stack_fffffffffffff468,
             in_stack_fffffffffffff460);
  std::__cxx11::string::~string(local_980);
  std::__cxx11::string::~string(local_9b0);
  std::__cxx11::string::~string(local_960);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_940);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff490);
    in_stack_fffffffffffff470 =
         testing::Message::operator<<
                   ((Message *)in_stack_fffffffffffff460,(char (*) [9])in_stack_fffffffffffff458);
    fmt::v5::format<char[5],char_const*>
              ((char (*) [5])in_stack_fffffffffffff498,(char **)in_stack_fffffffffffff490);
    in_stack_fffffffffffff468 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         testing::Message::operator<<
                   ((Message *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
    in_stack_fffffffffffff460 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x1ac8b4);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff490,TVar7,file,(int)((ulong)expected_expression >> 0x20),
               (char *)in_stack_fffffffffffff470);
    testing::internal::AssertHelper::operator=(this,in_stack_fffffffffffff4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff460);
    std::__cxx11::string::~string(local_9d8);
    testing::Message::~Message((Message *)0x1ac91b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ac9b2);
  std::__cxx11::ostringstream::str();
  fmt::v5::format<char[5],char_const*>
            ((char (*) [5])in_stack_fffffffffffff498,(char **)in_stack_fffffffffffff490);
  fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
            ((basic_string_view<char> *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
  format_10.size_ = (size_t)in_stack_fffffffffffff4a8;
  format_10.data_ = (char *)in_stack_fffffffffffff4a0;
  make_positional_abi_cxx11_(format_10);
  fmt::v5::sprintf<std::__cxx11::string,short>
            (in_stack_fffffffffffff498,(short *)in_stack_fffffffffffff490);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (expected_expression,(char *)in_stack_fffffffffffff470,in_stack_fffffffffffff468,
             in_stack_fffffffffffff460);
  iVar5 = (int)((ulong)expected_expression >> 0x20);
  std::__cxx11::string::~string(local_a30);
  std::__cxx11::string::~string(local_a50);
  std::__cxx11::string::~string(local_a80);
  std::__cxx11::string::~string(local_a10);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_9f0);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff490);
    testing::AssertionResult::failure_message((AssertionResult *)0x1acb73);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff490,TVar7,file,iVar5,(char *)in_stack_fffffffffffff470);
    testing::internal::AssertHelper::operator=(this,in_stack_fffffffffffff4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff460);
    testing::Message::~Message((Message *)0x1acbce);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1acc39);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

void TestLength(const char *length_spec, U value) {
  long long signed_value = 0;
  unsigned long long unsigned_value = 0;
  // Apply integer promotion to the argument.
  using std::numeric_limits;
  unsigned long long max = numeric_limits<U>::max();
  using fmt::internal::const_check;
  if (const_check(max <= static_cast<unsigned>(numeric_limits<int>::max()))) {
    signed_value = static_cast<int>(value);
    unsigned_value = static_cast<unsigned>(value);
  } else if (const_check(max <= numeric_limits<unsigned>::max())) {
    signed_value = static_cast<unsigned>(value);
    unsigned_value = static_cast<unsigned>(value);
  }
  if (sizeof(U) <= sizeof(int) && sizeof(int) < sizeof(T)) {
    signed_value = static_cast<long long>(value);
    unsigned_value =
        static_cast<typename std::make_unsigned<unsigned>::type>(value);
  } else {
    signed_value = static_cast<typename make_signed<T>::type>(value);
    unsigned_value = static_cast<typename std::make_unsigned<T>::type>(value);
  }
  std::ostringstream os;
  os << signed_value;
  EXPECT_PRINTF(os.str(), fmt::format("%{}d", length_spec), value);
  EXPECT_PRINTF(os.str(), fmt::format("%{}i", length_spec), value);
  os.str("");
  os << unsigned_value;
  EXPECT_PRINTF(os.str(), fmt::format("%{}u", length_spec), value);
  os.str("");
  os << std::oct << unsigned_value;
  EXPECT_PRINTF(os.str(), fmt::format("%{}o", length_spec), value);
  os.str("");
  os << std::hex << unsigned_value;
  EXPECT_PRINTF(os.str(), fmt::format("%{}x", length_spec), value);
  os.str("");
  os << std::hex << std::uppercase << unsigned_value;
  EXPECT_PRINTF(os.str(), fmt::format("%{}X", length_spec), value);
}